

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgenericitemmodel.cpp
# Opt level: O3

QVariant * __thiscall
QGenericItemModel::data
          (QVariant *__return_storage_ptr__,QGenericItemModel *this,QModelIndex *index,int role)

{
  undefined8 *puVar1;
  long in_FS_OFFSET;
  int local_2c;
  int *local_28;
  QModelIndex *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = &local_2c;
  puVar1 = *(undefined8 **)(this + 0x10);
  (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
  *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
  local_2c = role;
  local_20 = index;
  (*(code *)*puVar1)(7,puVar1,__return_storage_ptr__);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QGenericItemModel::data(const QModelIndex &index, int role) const
{
    return impl->callConst<QVariant>(QGenericItemModelImplBase::Data, index, role);
}